

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

string * __thiscall
libcellml::Variable::interfaceType_abi_cxx11_(string *__return_storage_ptr__,Variable *this)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  
  pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = pEVar1[7].mId.field_2._M_allocated_capacity;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,sVar2,
             *(long *)((long)&pEVar1[7].mId.field_2 + 8) + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::interfaceType() const
{
    return pFunc()->mInterfaceType;
}